

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O0

double __thiscall icu_63::double_conversion::Double::NextDouble(Double *this)

{
  int iVar1;
  uint64_t uVar2;
  Double local_30;
  Double local_28;
  Double local_20;
  Double *local_18;
  Double *this_local;
  
  local_18 = this;
  if (this->d64_ == 0x7ff0000000000000) {
    Double(&local_20,0x7ff0000000000000);
    this_local = (Double *)value(&local_20);
  }
  else {
    iVar1 = Sign(this);
    if ((iVar1 < 0) && (uVar2 = Significand(this), uVar2 == 0)) {
      return 0.0;
    }
    iVar1 = Sign(this);
    if (iVar1 < 0) {
      Double(&local_28,this->d64_ - 1);
      this_local = (Double *)value(&local_28);
    }
    else {
      Double(&local_30,this->d64_ + 1);
      this_local = (Double *)value(&local_30);
    }
  }
  return (double)this_local;
}

Assistant:

double NextDouble() const {
    if (d64_ == kInfinity) return Double(kInfinity).value();
    if (Sign() < 0 && Significand() == 0) {
      // -0.0
      return 0.0;
    }
    if (Sign() < 0) {
      return Double(d64_ - 1).value();
    } else {
      return Double(d64_ + 1).value();
    }
  }